

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

void __thiscall
QO_Manager::QO_Manager
          (QO_Manager *this,QL_Manager *qlm,int nRelations,RelCatEntry *relations,int nAttributes,
          AttrCatEntry *attributes,int nConditions,Condition *conditions)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_> mapper;
  _Rb_tree<int,_std::pair<const_int,_costElem_*>,_std::_Select1st<std::pair<const_int,_costElem_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
  local_60;
  
  this->qlm = qlm;
  (this->optcost).
  super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optcost).
  super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optcost).
  super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  iVar2 = 0;
  if (0 < nRelations) {
    iVar2 = nRelations;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
    ::push_back(&this->optcost,(value_type *)&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_costElem_*>,_std::_Select1st<std::pair<const_int,_costElem_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
    ::~_Rb_tree(&local_60);
  }
  this->nRels = nRelations;
  this->nAttrs = nAttributes;
  this->nConds = nConditions;
  this->rels = relations;
  this->attrs = attributes;
  this->conds = conditions;
  return;
}

Assistant:

QO_Manager::QO_Manager(QL_Manager &qlm, int nRelations, RelCatEntry *relations, int nAttributes, AttrCatEntry *attributes, 
    int nConditions, const Condition conditions[]) : qlm(qlm) {
  // Construct the new optjoin 
  for(int i=0; i < nRelations; i++){
    map<int, costElem*>  mapper;
    optcost.push_back(mapper);
  }

  nRels = nRelations;
  nAttrs = nAttributes;
  nConds = nConditions;
  rels = relations;
  attrs = attributes;
  conds = conditions;
}